

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_match.cpp
# Opt level: O3

matches * find_best_matches(matches *__return_storage_ptr__,image_descriptors *descriptors,
                           CSD *base_descriptor)

{
  pointer ppVar1;
  pointer ppVar2;
  ulong uVar3;
  pointer __p;
  float fVar4;
  value_type local_60;
  
  (__return_storage_ptr__->c).
  super__Vector_base<std::pair<float,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<float,_std::filesystem::__cxx11::path>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->c).
  super__Vector_base<std::pair<float,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<float,_std::filesystem::__cxx11::path>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->c).
  super__Vector_base<std::pair<float,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<float,_std::filesystem::__cxx11::path>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar1 = (descriptors->
           super__Vector_base<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>,_std::allocator<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (app.matches_num == -1) {
    app.matches_num =
         (int)((ulong)((long)ppVar1 -
                      (long)(descriptors->
                            super__Vector_base<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>,_std::allocator<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
  }
  __p = (descriptors->
        super__Vector_base<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>,_std::allocator<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if (__p != ppVar1) {
    uVar3 = (ulong)app.matches_num;
    do {
      fVar4 = image_match::compare(base_descriptor,&__p->second);
      ppVar2 = (__return_storage_ptr__->c).
               super__Vector_base<std::pair<float,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<float,_std::filesystem::__cxx11::path>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(__return_storage_ptr__->c).
                         super__Vector_base<std::pair<float,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<float,_std::filesystem::__cxx11::path>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 4) *
                 -0x5555555555555555) < uVar3) {
        local_60.first = fVar4;
        CLI::std::filesystem::__cxx11::path::path(&local_60.second,&__p->first);
        CLI::std::
        priority_queue<std::pair<float,_std::filesystem::__cxx11::path>,_std::vector<std::pair<float,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<float,_std::filesystem::__cxx11::path>_>_>,_similarity_pair_less>
        ::push(__return_storage_ptr__,&local_60);
LAB_001112bd:
        CLI::std::filesystem::__cxx11::path::~path(&local_60.second);
      }
      else if (fVar4 < ppVar2->first) {
        std::
        pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,std::filesystem::__cxx11::path>*,std::vector<std::pair<float,std::filesystem::__cxx11::path>,std::allocator<std::pair<float,std::filesystem::__cxx11::path>>>>,similarity_pair_less>
                  ();
        ppVar2 = (__return_storage_ptr__->c).
                 super__Vector_base<std::pair<float,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<float,_std::filesystem::__cxx11::path>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->c).
        super__Vector_base<std::pair<float,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<float,_std::filesystem::__cxx11::path>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar2 + -1;
        CLI::std::filesystem::__cxx11::path::~path(&ppVar2[-1].second);
        local_60.first = fVar4;
        CLI::std::filesystem::__cxx11::path::path(&local_60.second,&__p->first);
        CLI::std::
        priority_queue<std::pair<float,_std::filesystem::__cxx11::path>,_std::vector<std::pair<float,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<float,_std::filesystem::__cxx11::path>_>_>,_similarity_pair_less>
        ::push(__return_storage_ptr__,&local_60);
        goto LAB_001112bd;
      }
      __p = __p + 1;
    } while (__p != ppVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

matches
find_best_matches(const image_descriptors& descriptors,
                  const image_match::CSD& base_descriptor)
{
    matches matches;

    if (app.matches_num == -1)
        app.matches_num = descriptors.size();

    size_t matches_num = app.matches_num;
    for (auto&& [p, descriptor] : descriptors) {
        auto similarity_index =
          image_match::compare(base_descriptor, descriptor);

        if (matches.size() < matches_num) {
            matches.push({ similarity_index, p });
        } else {
            auto index = matches.top().first;
            if (similarity_index < index) {
                matches.pop();
                matches.push({ similarity_index, p });
            }
        }
    }

    return matches;
}